

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwlock_test.cpp
# Opt level: O0

void __thiscall
SharedMutexTest_TryLockFail_Test<yamc::fair::basic_shared_mutex<yamc::rwlock::PhaseFairness>_>::
TestBody(SharedMutexTest_TryLockFail_Test<yamc::fair::basic_shared_mutex<yamc::rwlock::PhaseFairness>_>
         *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_178;
  AssertHelper local_158;
  Message local_150;
  bool local_141;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_;
  join_thread local_120;
  join_thread thd;
  basic_shared_mutex<yamc::rwlock::PhaseFairness> local_108 [8];
  TypeParam mtx;
  undefined1 local_80 [8];
  barrier step;
  SharedMutexTest_TryLockFail_Test<yamc::fair::basic_shared_mutex<yamc::rwlock::PhaseFairness>_>
  *this_local;
  
  step.mtx_.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)this;
  yamc::test::barrier::barrier((barrier *)local_80,2);
  yamc::fair::basic_shared_mutex<yamc::rwlock::PhaseFairness>::basic_shared_mutex(local_108);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )local_108;
  yamc::test::join_thread::
  join_thread<SharedMutexTest_TryLockFail_Test<yamc::fair::basic_shared_mutex<yamc::rwlock::PhaseFairness>>::TestBody()::_lambda()_1_>
            (&local_120,(type *)&gtest_ar_.message_);
  yamc::test::barrier::await((barrier *)local_80);
  bVar1 = yamc::fair::basic_shared_mutex<yamc::rwlock::PhaseFairness>::try_lock(local_108);
  local_141 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_140,&local_141,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_178,(internal *)local_140,(AssertionResult *)"mtx.try_lock()","true","false",
               in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/rwlock_test.cpp"
               ,0x82,message);
    testing::internal::AssertHelper::operator=(&local_158,&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    std::__cxx11::string::~string((string *)&local_178);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  yamc::test::barrier::await((barrier *)local_80);
  yamc::test::join_thread::~join_thread(&local_120);
  yamc::fair::basic_shared_mutex<yamc::rwlock::PhaseFairness>::~basic_shared_mutex(local_108);
  yamc::test::barrier::~barrier((barrier *)local_80);
  return;
}

Assistant:

TYPED_TEST(SharedMutexTest, TryLockFail)
{
  yamc::test::barrier step(2);
  TypeParam mtx;
  // reader-thread
  yamc::test::join_thread thd([&]{
    ASSERT_NO_THROW(mtx.lock_shared());
    step.await();  // b1
    step.await();  // b2
    ASSERT_NO_THROW(mtx.unlock_shared());
  });
  // writer-thread
  {
    step.await();  // b1
    EXPECT_FALSE(mtx.try_lock());
    step.await();  // b2
  }
}